

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O0

ion_status_t
linear_hash_insert(ion_key_t key,ion_value_t value,int hash_bucket_idx,
                  linear_hash_table_t *linear_hash)

{
  long lVar1;
  linear_hash_bucket_t bucket_00;
  ion_byte_t *piVar2;
  ion_byte_t *linear_hash_00;
  void *__src;
  ion_value_t __src_00;
  ion_key_t pvVar3;
  ion_key_t pvVar4;
  ion_err_t iVar5;
  int iVar6;
  ion_byte_t *piVar7;
  ion_fpos_t *piVar8;
  ion_fpos_t iVar9;
  ion_fpos_t *piVar10;
  ion_byte_t aiStack_90 [8];
  ion_fpos_t iStack_88;
  ion_byte_t aiStack_80 [8];
  long *local_78;
  ion_fpos_t *overflow_location;
  ion_fpos_t record_loc;
  ion_fpos_t bucket_records_loc;
  linear_hash_bucket_t bucket;
  ion_fpos_t bucket_loc;
  ion_byte_t *piStack_40;
  ion_byte_t record_status;
  ion_byte_t *record_value;
  ion_byte_t *record_key;
  linear_hash_table_t *linear_hash_local;
  ion_value_t pvStack_20;
  int hash_bucket_idx_local;
  ion_value_t value_local;
  ion_key_t key_local;
  ion_status_t status;
  
  key_local = (ion_key_t)0x12;
  record_key = (ion_byte_t *)linear_hash;
  linear_hash_local._4_4_ = hash_bucket_idx;
  pvStack_20 = value;
  value_local = key;
  if (hash_bucket_idx < linear_hash->next_split) {
    builtin_memcpy(aiStack_80,"{,\x11",4);
    aiStack_80[4] = '\0';
    aiStack_80[5] = '\0';
    aiStack_80[6] = '\0';
    aiStack_80[7] = '\0';
    linear_hash_local._4_4_ = hash_to_bucket((ion_byte_t *)key,linear_hash);
  }
  __src_00 = value_local;
  piVar7 = (ion_byte_t *)
           ((long)&local_78 - ((long)*(int *)(record_key + 4) + 0xfU & 0xfffffffffffffff0));
  lVar1 = -((long)*(int *)(record_key + 8) + 0xfU & 0xfffffffffffffff0);
  piVar8 = (ion_fpos_t *)(piVar7 + lVar1);
  bucket_loc._7_1_ = 1;
  iVar6 = *(int *)(record_key + 4);
  piStack_40 = (ion_byte_t *)piVar8;
  record_value = piVar7;
  *(ion_byte_t *)((long)piVar8 + -8) = 0xd1;
  *(ion_byte_t *)((long)piVar8 + -7) = ',';
  *(ion_byte_t *)((long)piVar8 + -6) = '\x11';
  *(ion_byte_t *)((long)piVar8 + -5) = '\0';
  *(ion_byte_t *)((long)piVar8 + -4) = '\0';
  *(ion_byte_t *)((long)piVar8 + -3) = '\0';
  *(ion_byte_t *)((long)piVar8 + -2) = '\0';
  *(ion_byte_t *)((long)piVar8 + -1) = '\0';
  memcpy(piVar7,__src_00,(long)iVar6);
  __src = pvStack_20;
  piVar2 = piStack_40;
  iVar6 = *(int *)(record_key + 8);
  *(ion_byte_t *)((long)piVar8 + -8) = 0xe6;
  *(ion_byte_t *)((long)piVar8 + -7) = ',';
  *(ion_byte_t *)((long)piVar8 + -6) = '\x11';
  *(ion_byte_t *)((long)piVar8 + -5) = '\0';
  *(ion_byte_t *)((long)piVar8 + -4) = '\0';
  *(ion_byte_t *)((long)piVar8 + -3) = '\0';
  *(ion_byte_t *)((long)piVar8 + -2) = '\0';
  *(ion_byte_t *)((long)piVar8 + -1) = '\0';
  memcpy(piVar2,__src,(long)iVar6);
  iVar6 = linear_hash_local._4_4_;
  piVar2 = record_key;
  *(ion_byte_t *)((long)piVar8 + -8) = 0xf2;
  *(ion_byte_t *)((long)piVar8 + -7) = ',';
  *(ion_byte_t *)((long)piVar8 + -6) = '\x11';
  *(ion_byte_t *)((long)piVar8 + -5) = '\0';
  *(ion_byte_t *)((long)piVar8 + -4) = '\0';
  *(ion_byte_t *)((long)piVar8 + -3) = '\0';
  *(ion_byte_t *)((long)piVar8 + -2) = '\0';
  *(ion_byte_t *)((long)piVar8 + -1) = '\0';
  iVar9 = bucket_idx_to_ion_fpos_t(iVar6,(linear_hash_table_t *)piVar2);
  piVar2 = record_key;
  bucket.overflow_location = iVar9;
  builtin_memcpy(piVar7 + lVar1 + -8,"\a-\x11",4);
  *(ion_byte_t *)((long)piVar8 + -4) = '\0';
  *(ion_byte_t *)((long)piVar8 + -3) = '\0';
  *(ion_byte_t *)((long)piVar8 + -2) = '\0';
  *(ion_byte_t *)((long)piVar8 + -1) = '\0';
  iVar5 = linear_hash_get_bucket
                    (iVar9,(linear_hash_bucket_t *)&bucket_records_loc,(linear_hash_table_t *)piVar2
                    );
  piVar2 = record_key;
  key_local = (ion_key_t)CONCAT71(key_local._1_7_,iVar5);
  if (iVar5 == '\0') {
    overflow_location = (ion_fpos_t *)(bucket.overflow_location + 0x10);
    record_loc = (ion_fpos_t)overflow_location;
    if (bucket_records_loc._4_4_ != 0) {
      bucket_00.record_count = bucket_records_loc._4_4_;
      bucket_00.idx = (int)bucket_records_loc;
      bucket_00.overflow_location._0_4_ = bucket.idx;
      bucket_00.overflow_location._4_4_ = bucket.record_count;
      builtin_memcpy(piVar7 + lVar1 + -8,"H-\x11",4);
      *(ion_byte_t *)((long)piVar8 + -4) = '\0';
      *(ion_byte_t *)((long)piVar8 + -3) = '\0';
      *(ion_byte_t *)((long)piVar8 + -2) = '\0';
      *(ion_byte_t *)((long)piVar8 + -1) = '\0';
      iVar6 = linear_hash_bucket_is_full(bucket_00,(linear_hash_table_t *)piVar2);
      piVar2 = record_key;
      if (iVar6 == 0) {
        overflow_location =
             (ion_fpos_t *)
             (bucket.overflow_location + 0x10 +
             (long)bucket_records_loc._4_4_ * *(long *)(record_key + 0x40));
      }
      else {
        piVar10 = (ion_fpos_t *)((long)piVar8 + -0x10);
        local_78 = piVar10;
        builtin_memcpy(piVar7 + lVar1 + -0x18,"k-\x11",4);
        *(ion_byte_t *)((long)piVar8 + -0x14) = '\0';
        *(ion_byte_t *)((long)piVar8 + -0x13) = '\0';
        *(ion_byte_t *)((long)piVar8 + -0x12) = '\0';
        *(ion_byte_t *)((long)piVar8 + -0x11) = '\0';
        iVar5 = create_overflow_bucket
                          ((int)bucket_records_loc,piVar10,(linear_hash_table_t *)piVar2);
        key_local = (ion_key_t)CONCAT71(key_local._1_7_,iVar5);
        if (iVar5 != '\0') {
          return (ion_status_t)key_local;
        }
        bucket_records_loc._4_4_ = 0;
        bucket.idx = (undefined4)bucket.overflow_location;
        bucket.record_count = bucket.overflow_location._4_4_;
        overflow_location = (ion_fpos_t *)(*local_78 + 0x10);
        bucket.overflow_location = *local_78;
        piVar8 = piVar10;
      }
    }
    linear_hash_00 = record_key;
    piVar7 = record_value;
    piVar2 = piStack_40;
    piVar10 = overflow_location;
    piVar8[-1] = 0x112ddf;
    iVar5 = linear_hash_write_record
                      ((ion_fpos_t)piVar10,piVar7,piVar2,(ion_byte_t *)((long)&bucket_loc + 7),
                       (linear_hash_table_t *)linear_hash_00);
    pvVar3 = key_local;
    piVar2 = record_key;
    iVar9 = bucket.overflow_location;
    key_local = (ion_key_t)CONCAT71(key_local._1_7_,iVar5);
    pvVar4 = key_local;
    if (iVar5 == '\0') {
      key_local._4_4_ = SUB84(pvVar3,4);
      key_local = (ion_key_t)CONCAT44(key_local._4_4_ + 1,(int)pvVar4);
      bucket_records_loc._4_4_ = bucket_records_loc._4_4_ + 1;
      piVar8[-1] = 0x112e10;
      iVar5 = linear_hash_update_bucket
                        (iVar9,(linear_hash_bucket_t *)&bucket_records_loc,
                         (linear_hash_table_t *)piVar2);
      piVar2 = record_key;
      key_local = (ion_key_t)CONCAT71(key_local._1_7_,iVar5);
      if (iVar5 == '\0') {
        key_local = (ion_key_t)((ulong)key_local._1_7_ << 8);
        piVar8[-1] = 0x112e2b;
        linear_hash_increment_num_records((linear_hash_table_t *)piVar2);
      }
    }
  }
  return (ion_status_t)key_local;
}

Assistant:

ion_status_t
linear_hash_insert(
	ion_key_t			key,
	ion_value_t			value,
	int					hash_bucket_idx,
	linear_hash_table_t *linear_hash
) {
	ion_status_t status = ION_STATUS_INITIALIZE;

	if (hash_bucket_idx < linear_hash->next_split) {
		hash_bucket_idx = hash_to_bucket(key, linear_hash);
	}

	/* create a linear_hash_record with the desired key, value, and status of full*/
	ion_byte_t	*record_key		= alloca(linear_hash->super.record.key_size);
	ion_byte_t	*record_value	= alloca(linear_hash->super.record.value_size);
	ion_byte_t	record_status	= linear_hash_record_status_full;

	memcpy(record_key, key, linear_hash->super.record.key_size);
	memcpy(record_value, value, linear_hash->super.record.value_size);

	/* get the appropriate bucket for insertion */
	ion_fpos_t				bucket_loc = bucket_idx_to_ion_fpos_t(hash_bucket_idx, linear_hash);
	linear_hash_bucket_t	bucket;

	status.error = linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

	if (status.error != err_ok) {
		return status;
	}

	/* location of the records in the bucket to be stored in */
	ion_fpos_t	bucket_records_loc = GET_BUCKET_RECORDS_LOC(bucket_loc);
	ion_fpos_t	record_loc;

	/* Case the bucket is empty */
	if (bucket.record_count == 0) {
		record_loc = bucket_records_loc;
	}
	else {
		/* Case that the bucket is full but there is not yet an overflow bucket */
		if (linear_hash_bucket_is_full(bucket, linear_hash)) {
			/* Get location of overflow bucket and update the tail record for the linked list of buckets storing
			 * items that hash to this bucket and update the tail bucket with the overflow's location */
			ion_fpos_t *overflow_location = alloca(sizeof(ion_fpos_t));

			status.error = create_overflow_bucket(bucket.idx, overflow_location, linear_hash);

			if (err_ok != status.error) {
				return status;
			}

			/* update parameters of bucket to match that of overflow just created */
			bucket.record_count			= 0;
			bucket.overflow_location	= bucket_loc;

			/* update the locations to write to in the file for the record and bucket */
			record_loc					= GET_BUCKET_RECORDS_LOC(*overflow_location);
			bucket_loc					= *overflow_location;
		}
		/* case there is >= 1 record in the bucket but it is not full */
		else {
			/* create a linear_hash_record with the desired key, value, and status of full*/
			record_loc = bucket_loc + sizeof(linear_hash_bucket_t) + bucket.record_count * linear_hash->record_total_size;
		}
	}

	/* write new record to the db */
	status.error = linear_hash_write_record(record_loc, record_key, record_value, &record_status, linear_hash);

	if (status.error != err_ok) {
		return status;
	}

	status.count++;

	/* update bucket */
	bucket.record_count++;
	status.error = linear_hash_update_bucket(bucket_loc, &bucket, linear_hash);

	if (status.error != err_ok) {
		return status;
	}

	status.error = err_ok;
	linear_hash_increment_num_records(linear_hash);
	return status;
}